

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdminPanelView.cpp
# Opt level: O0

void __thiscall AdminPanelView::display(AdminPanelView *this)

{
  int iVar1;
  ostream *poVar2;
  Application *this_00;
  BaseUser *this_01;
  string local_30;
  AdminPanelView *local_10;
  AdminPanelView *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Admin: ");
  this_00 = Application::getInstance();
  this_01 = Application::getCurrentUser(this_00);
  BaseUser::getFullName_abi_cxx11_(&local_30,this_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_30);
  View::populateMenu(&this->super_View);
  iVar1 = Input::getInt();
  View::callView(&this->super_View,iVar1 + -1);
  return;
}

Assistant:

void AdminPanelView::display() {
    cout << "Admin: " << Application::getInstance().getCurrentUser()->getFullName() << endl;
    populateMenu();
    callView(Input::getInt() - 1);
}